

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

matd_t * matd_op_recurse(char *expr,int *pos,matd_t *acc,matd_t **args,int *argpos,matd_t **garb,
                        int *garbpos,int oneterm)

{
  matd_t mVar1;
  matd_t *pmVar2;
  double v;
  matd_t *res_7;
  matd_t *rhs_7;
  matd_t *res_6;
  matd_t *rhs_6;
  matd_t *res_5;
  matd_t *rhs_5;
  matd_t *res_4;
  matd_t *rhs_4;
  double s;
  char *end;
  char *start;
  matd_t *res_3;
  matd_t *rhs_3;
  matd_t *res_2;
  matd_t *rhs_2;
  matd_t *res_1;
  matd_t *rhs_1;
  matd_t *res;
  matd_t *rhs;
  matd_t **garb_local;
  int *argpos_local;
  matd_t **args_local;
  matd_t *acc_local;
  int *pos_local;
  char *expr_local;
  
  rhs = (matd_t *)garb;
  garb_local = (matd_t **)argpos;
  argpos_local = (int *)args;
  mVar1 = (matd_t)acc;
  acc_local = (matd_t *)pos;
  pos_local = (int *)expr;
LAB_004f246a:
  args_local = (matd_t **)mVar1;
  if (*(char *)((long)pos_local + (long)(int)acc_local->nrows) == '\0') {
    return (matd_t *)args_local;
  }
  switch(*(undefined1 *)((long)pos_local + (long)(int)acc_local->nrows)) {
  case 0x20:
    acc_local->nrows = acc_local->nrows + 1;
    mVar1 = (matd_t)args_local;
    goto LAB_004f246a;
  default:
    goto switchD_004f24bb_caseD_21;
  case 0x28:
    if ((oneterm == 0) || (args_local == (matd_t **)0x0)) {
      acc_local->nrows = acc_local->nrows + 1;
      res = matd_op_recurse((char *)pos_local,(int *)acc_local,(matd_t *)0x0,(matd_t **)argpos_local
                            ,(int *)garb_local,(matd_t **)rhs,garbpos,0);
      res = matd_op_gobble_right((char *)pos_local,(int *)acc_local,res,(matd_t **)rhs,garbpos);
      mVar1 = (matd_t)res;
      if (args_local != (matd_t **)0x0) {
        rhs_1 = matd_multiply((matd_t *)args_local,res);
        rhs[*garbpos] = (matd_t)rhs_1;
        *garbpos = *garbpos + 1;
        mVar1 = (matd_t)rhs_1;
      }
      goto LAB_004f246a;
    }
    break;
  case 0x29:
    if (oneterm == 0) {
      acc_local->nrows = acc_local->nrows + 1;
    }
    break;
  case 0x2a:
    acc_local->nrows = acc_local->nrows + 1;
    res_1 = matd_op_recurse((char *)pos_local,(int *)acc_local,(matd_t *)0x0,(matd_t **)argpos_local
                            ,(int *)garb_local,(matd_t **)rhs,garbpos,1);
    res_1 = matd_op_gobble_right((char *)pos_local,(int *)acc_local,res_1,(matd_t **)rhs,garbpos);
    mVar1 = (matd_t)res_1;
    if (args_local != (matd_t **)0x0) {
      rhs_2 = matd_multiply((matd_t *)args_local,res_1);
      rhs[*garbpos] = (matd_t)rhs_2;
      *garbpos = *garbpos + 1;
      mVar1 = (matd_t)rhs_2;
    }
    goto LAB_004f246a;
  case 0x2b:
    if ((oneterm == 0) || (args_local == (matd_t **)0x0)) {
      if (args_local == (matd_t **)0x0) {
        __assert_fail("acc != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                      ,0x2e0,
                      "matd_t *matd_op_recurse(const char *, int *, matd_t *, matd_t **, int *, matd_t **, int *, int)"
                     );
      }
      acc_local->nrows = acc_local->nrows + 1;
      pmVar2 = matd_op_recurse((char *)pos_local,(int *)acc_local,(matd_t *)0x0,
                               (matd_t **)argpos_local,(int *)garb_local,(matd_t **)rhs,garbpos,1);
      pmVar2 = matd_op_gobble_right
                         ((char *)pos_local,(int *)acc_local,pmVar2,(matd_t **)rhs,garbpos);
      mVar1 = (matd_t)matd_add((matd_t *)args_local,pmVar2);
      rhs[*garbpos] = mVar1;
      *garbpos = *garbpos + 1;
      goto LAB_004f246a;
    }
    break;
  case 0x2d:
    if ((oneterm == 0) || (args_local == (matd_t **)0x0)) {
      if (args_local == (matd_t **)0x0) {
        acc_local->nrows = acc_local->nrows + 1;
        pmVar2 = matd_op_recurse((char *)pos_local,(int *)acc_local,(matd_t *)0x0,
                                 (matd_t **)argpos_local,(int *)garb_local,(matd_t **)rhs,garbpos,1)
        ;
        pmVar2 = matd_op_gobble_right
                           ((char *)pos_local,(int *)acc_local,pmVar2,(matd_t **)rhs,garbpos);
        mVar1 = (matd_t)matd_scale(pmVar2,-1.0);
        rhs[*garbpos] = mVar1;
        *garbpos = *garbpos + 1;
      }
      else {
        acc_local->nrows = acc_local->nrows + 1;
        pmVar2 = matd_op_recurse((char *)pos_local,(int *)acc_local,(matd_t *)0x0,
                                 (matd_t **)argpos_local,(int *)garb_local,(matd_t **)rhs,garbpos,1)
        ;
        pmVar2 = matd_op_gobble_right
                           ((char *)pos_local,(int *)acc_local,pmVar2,(matd_t **)rhs,garbpos);
        mVar1 = (matd_t)matd_subtract((matd_t *)args_local,pmVar2);
        rhs[*garbpos] = mVar1;
        *garbpos = *garbpos + 1;
      }
      goto LAB_004f246a;
    }
    break;
  case 0x2e:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    end = (char *)((long)pos_local + (long)(int)acc_local->nrows);
    v = strtod(end,(char **)&s);
    acc_local->nrows = acc_local->nrows + (SUB84(s,0) - (int)end);
    mVar1 = (matd_t)matd_create_scalar(v);
    rhs[*garbpos] = mVar1;
    *garbpos = *garbpos + 1;
    mVar1 = (matd_t)matd_op_gobble_right
                              ((char *)pos_local,(int *)acc_local,(matd_t *)mVar1,(matd_t **)rhs,
                               garbpos);
    if (args_local != (matd_t **)0x0) {
      mVar1 = (matd_t)matd_multiply((matd_t *)args_local,(matd_t *)mVar1);
      rhs[*garbpos] = mVar1;
      *garbpos = *garbpos + 1;
    }
    goto LAB_004f246a;
  case 0x46:
    res_2 = *(matd_t **)(argpos_local + (long)*(int *)garb_local * 2);
    rhs[*garbpos] = (matd_t)res_2;
    *garbpos = *garbpos + 1;
    acc_local->nrows = acc_local->nrows + 1;
    *(int *)garb_local = *(int *)garb_local + 1;
    res_2 = matd_op_gobble_right((char *)pos_local,(int *)acc_local,res_2,(matd_t **)rhs,garbpos);
    mVar1 = (matd_t)res_2;
    if (args_local != (matd_t **)0x0) {
      rhs_3 = matd_multiply((matd_t *)args_local,res_2);
      rhs[*garbpos] = (matd_t)rhs_3;
      *garbpos = *garbpos + 1;
      mVar1 = (matd_t)rhs_3;
    }
    goto LAB_004f246a;
  case 0x4d:
    res_3 = *(matd_t **)(argpos_local + (long)*(int *)garb_local * 2);
    acc_local->nrows = acc_local->nrows + 1;
    *(int *)garb_local = *(int *)garb_local + 1;
    res_3 = matd_op_gobble_right((char *)pos_local,(int *)acc_local,res_3,(matd_t **)rhs,garbpos);
    mVar1 = (matd_t)res_3;
    if (args_local != (matd_t **)0x0) {
      start = (char *)matd_multiply((matd_t *)args_local,res_3);
      rhs[*garbpos] = (matd_t)start;
      *garbpos = *garbpos + 1;
      mVar1 = (matd_t)start;
    }
    goto LAB_004f246a;
  }
  return (matd_t *)args_local;
switchD_004f24bb_caseD_21:
  fprintf(_stderr,"matd_op(): Unknown character: \'%c\'\n",
          (ulong)(uint)(int)*(char *)((long)pos_local + (long)(int)acc_local->nrows));
  mVar1 = (matd_t)args_local;
  if (*(char *)((long)pos_local + (long)(int)acc_local->nrows) ==
      *(char *)((long)pos_local + (long)(int)acc_local->nrows)) {
    __assert_fail("expr[*pos] != expr[*pos]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x311,
                  "matd_t *matd_op_recurse(const char *, int *, matd_t *, matd_t **, int *, matd_t **, int *, int)"
                 );
  }
  goto LAB_004f246a;
}

Assistant:

static matd_t *matd_op_recurse(const char *expr, int *pos, matd_t *acc, matd_t **args, int *argpos,
                               matd_t **garb, int *garbpos, int oneterm)
{
    while (expr[*pos] != 0) {

        switch (expr[*pos]) {

            case '(': {
                if (oneterm && acc != NULL)
                    return acc;
                (*pos)++;
                matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 0);
                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case ')': {
                if (oneterm)
                    return acc;

                (*pos)++;
                return acc;
            }

            case '*': {
                (*pos)++;

                matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case 'F': {
                matd_t *rhs = args[*argpos];
                garb[*garbpos] = rhs;
                (*garbpos)++;

                (*pos)++;
                (*argpos)++;

                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case 'M': {
                matd_t *rhs = args[*argpos];

                (*pos)++;
                (*argpos)++;

                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

/*
  case 'D': {
  int rows = expr[*pos+1]-'0';
  int cols = expr[*pos+2]-'0';

  matd_t *rhs = matd_create(rows, cols);

  break;
  }
*/
                // a constant (SCALAR) defined inline. Treat just like M, creating a matd_t on the fly.
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            case '.': {
                const char *start = &expr[*pos];
                char *end;
                double s = strtod(start, &end);
                (*pos) += (end - start);
                matd_t *rhs = matd_create_scalar(s);
                garb[*garbpos] = rhs;
                (*garbpos)++;

                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                if (acc == NULL) {
                    acc = rhs;
                } else {
                    matd_t *res = matd_multiply(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }

                break;
            }

            case '+': {
                if (oneterm && acc != NULL)
                    return acc;

                // don't support unary plus
                assert(acc != NULL);
                (*pos)++;
                matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                matd_t *res = matd_add(acc, rhs);

                garb[*garbpos] = res;
                (*garbpos)++;
                acc = res;
                break;
            }

            case '-': {
                if (oneterm && acc != NULL)
                    return acc;

                if (acc == NULL) {
                    // unary minus
                    (*pos)++;
                    matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                    rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                    matd_t *res = matd_scale(rhs, -1);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                } else {
                    // subtract
                    (*pos)++;
                    matd_t *rhs = matd_op_recurse(expr, pos, NULL, args, argpos, garb, garbpos, 1);
                    rhs = matd_op_gobble_right(expr, pos, rhs, garb, garbpos);

                    matd_t *res = matd_subtract(acc, rhs);
                    garb[*garbpos] = res;
                    (*garbpos)++;
                    acc = res;
                }
                break;
            }

            case ' ': {
                // nothing to do. spaces are meaningless.
                (*pos)++;
                break;
            }

            default: {
                fprintf(stderr, "matd_op(): Unknown character: '%c'\n", expr[*pos]);
                assert(expr[*pos] != expr[*pos]);
            }
        }
    }
    return acc;
}